

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O2

el_action_t ce_search_line(EditLine *el,wchar_t dir)

{
  wchar_t *pat;
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t *str;
  
  str = (el->el_line).cursor;
  pwVar2 = (el->el_search).patbuf;
  pat = pwVar2 + 1;
  wVar1 = pwVar2[1];
  pwVar2[1] = L'^';
  if (dir == L'\x18') {
    for (; (el->el_line).buffer <= str; str = str + -1) {
      wVar3 = el_match(str,pat);
      if (wVar3 != L'\0') {
LAB_0011c6c2:
        *pat = wVar1;
        (el->el_line).cursor = str;
        return '\0';
      }
    }
  }
  else {
    for (; (*str != L'\0' && (str < (el->el_line).limit)); str = str + 1) {
      wVar3 = el_match(str,pat);
      if (wVar3 != L'\0') goto LAB_0011c6c2;
    }
  }
  *pat = wVar1;
  return '\x06';
}

Assistant:

libedit_private el_action_t
ce_search_line(EditLine *el, int dir)
{
	wchar_t *cp = el->el_line.cursor;
	wchar_t *pattern = el->el_search.patbuf;
	wchar_t oc, *ocp;
#ifdef ANCHOR
	ocp = &pattern[1];
	oc = *ocp;
	*ocp = '^';
#else
	ocp = pattern;
	oc = *ocp;
#endif

	if (dir == ED_SEARCH_PREV_HISTORY) {
		for (; cp >= el->el_line.buffer; cp--) {
			if (el_match(cp, ocp)) {
				*ocp = oc;
				el->el_line.cursor = cp;
				return CC_NORM;
			}
		}
		*ocp = oc;
		return CC_ERROR;
	} else {
		for (; *cp != '\0' && cp < el->el_line.limit; cp++) {
			if (el_match(cp, ocp)) {
				*ocp = oc;
				el->el_line.cursor = cp;
				return CC_NORM;
			}
		}
		*ocp = oc;
		return CC_ERROR;
	}
}